

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void array_set_list(t_array_rangeop *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_float tVar2;
  int local_48;
  int local_44;
  int i;
  int arrayonset;
  int nitem;
  int stride;
  char *firstitem;
  char *itemp;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *s_local;
  t_array_rangeop *x_local;
  
  itemp = (char *)argv;
  argv_local._4_4_ = argc;
  ptStack_18 = s;
  s_local = (t_symbol *)x;
  iVar1 = array_rangeop_getrange(x,(char **)&nitem,&i,&arrayonset,&local_44);
  if (iVar1 != 0) {
    if (argv_local._4_4_ < i) {
      i = argv_local._4_4_;
    }
    firstitem = _nitem;
    for (local_48 = 0; local_48 < i; local_48 = local_48 + 1) {
      tVar2 = atom_getfloatarg(local_48,argv_local._4_4_,(t_atom *)itemp);
      *(t_float *)firstitem = tVar2;
      firstitem = firstitem + arrayonset;
    }
    array_client_senditup((t_array_client *)s_local);
  }
  return;
}

Assistant:

static void array_set_list(t_array_rangeop *x, t_symbol *s,
    int argc, t_atom *argv)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    if (nitem > argc)
        nitem = argc;
    for (i = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        *(t_float *)itemp = atom_getfloatarg(i, argc, argv);
    array_client_senditup(&x->x_tc);
}